

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

void list_append_new(list_t *list,void *data)

{
  list_node_t *plVar1;
  list_node_t *plVar2;
  
  plVar2 = (list_node_t *)malloc(0x18);
  plVar2->next = (list_node_t *)0x0;
  plVar2->prev = (list_node_t *)0x0;
  plVar2->data = data;
  plVar1 = list->tail;
  if (plVar1 != (list_node_t *)0x0) {
    plVar2->prev = plVar1;
    plVar1->next = plVar2;
  }
  list->tail = plVar2;
  if (list->head == (list_node_t *)0x0) {
    list->head = plVar2;
  }
  return;
}

Assistant:

void
list_append_new(
    list_t* list,
    void* data)
{
    list_node_t* node = list_node_new();
    node->data = data;
    list_append(list, node);
}